

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O1

Vec_Int_t * Glucose_SolverFromAig2(Gia_Man_t *p,SimpSolver *S)

{
  int *piVar1;
  int iVar2;
  Cnf_Dat_t *p_00;
  Vec_Int_t *pVVar3;
  int *__dest;
  long lVar4;
  
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,1,0,0);
  lVar4 = 0;
  do {
    if (p_00->nClauses <= lVar4) {
      piVar1 = p_00->pVarNums;
      iVar2 = p_00->nVars;
      pVVar3 = (Vec_Int_t *)malloc(0x10);
      pVVar3->nSize = iVar2;
      pVVar3->nCap = iVar2;
      __dest = (int *)malloc((long)iVar2 << 2);
      pVVar3->pArray = __dest;
      memcpy(__dest,piVar1,(long)iVar2 << 2);
      Cnf_DataFree(p_00);
      return pVVar3;
    }
    piVar1 = p_00->pClauses[lVar4];
    iVar2 = glucose_solver_addclause
                      (S,piVar1,(int)((ulong)((long)p_00->pClauses[lVar4 + 1] - (long)piVar1) >> 2))
    ;
    lVar4 = lVar4 + 1;
  } while (iVar2 != 0);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                ,0x2d6,"Vec_Int_t *Glucose_SolverFromAig2(Gia_Man_t *, SimpSolver &)");
}

Assistant:

Vec_Int_t * Glucose_SolverFromAig2( Gia_Man_t * p, SimpSolver& S ) 
{
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8 /*nLutSize*/, 0 /*fCnfObjIds*/, 1/*fAddOrCla*/, 0, 0/*verbose*/ );
    for ( int i = 0; i < pCnf->nClauses; i++ )
        if ( !glucose_solver_addclause( &S, pCnf->pClauses[i], pCnf->pClauses[i+1]-pCnf->pClauses[i] ) )
            assert( 0 );
    Vec_Int_t * vCnfIds = Vec_IntAllocArrayCopy(pCnf->pVarNums,pCnf->nVars);
    //printf( "CNF stats: Vars = %6d. Clauses = %7d. Literals = %8d. ", pCnf->nVars, pCnf->nClauses, pCnf->nLiterals );
    //Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Cnf_DataFree(pCnf);
    return vCnfIds;
}